

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

OpenJTalk * openjtalk_initializeU16(char16_t *voice,char16_t *dic,char16_t *voiceDir)

{
  OpenJTalk *pOVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char voiceDir_temp [260];
  char dic_temp [260];
  char voice_temp [260];
  undefined1 in_stack_fffffffffffffcb8;
  uint7 in_stack_fffffffffffffcb9;
  char16_t *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  
  if (in_RDI != 0) {
    u16tou8_path(in_stack_fffffffffffffcc0,
                 (char *)CONCAT71(in_stack_fffffffffffffcb9,in_stack_fffffffffffffcb8));
  }
  if (in_RSI != 0) {
    u16tou8_path(in_stack_fffffffffffffcc0,
                 (char *)CONCAT71(in_stack_fffffffffffffcb9,in_stack_fffffffffffffcb8));
  }
  if (in_RDX != 0) {
    u16tou8_path(in_stack_fffffffffffffcc0,(char *)((ulong)in_stack_fffffffffffffcb9 << 8));
  }
  pOVar1 = openjtalk_initialize_sub
                     (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8)
  ;
  return pOVar1;
}

Assistant:

OPENJTALK_DLL_API OpenJTalk *OPENJTALK_CONVENTION openjtalk_initializeU16(const char16_t *voice, const char16_t *dic, const char16_t *voiceDir)
{
	char voice_temp[MAX_PATH];
	char dic_temp[MAX_PATH];
	char voiceDir_temp[MAX_PATH];

	voice_temp[0] = '\0';
	if (voice != NULL)
	{
#if defined(_WIN32)
		u16tou8_path(voice, voice_temp);
#else
		u16tou8_path(voice, voice_temp);
#endif
	}

	dic_temp[0] = '\0';
	if (dic != NULL)
	{
#if defined(_WIN32)
		u16tou8_path(dic, dic_temp);
#else
		u16tou8_path(dic, dic_temp);
#endif
	}

	voiceDir_temp[0] = '\0';
	if (voiceDir != NULL)
	{
#if defined(_WIN32)
		u16tou8_path(voiceDir, voiceDir_temp);
#else
		u16tou8_path(voiceDir, voiceDir_temp);
#endif
	}

	return openjtalk_initialize_sub(voice_temp, dic_temp, voiceDir_temp);
}